

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::lzcompressor(lzcompressor *this,lzham_malloc_context malloc_context)

{
  long lVar1;
  void *in_RSI;
  lzham_malloc_context in_RDI;
  search_accelerator *unaff_retaddr;
  uint i;
  lzham_malloc_context in_stack_000000b8;
  state *in_stack_000000c0;
  lzham_malloc_context in_stack_ffffffffffffff68;
  raw_parse_thread_state *in_stack_ffffffffffffff70;
  coding_stats *in_stack_ffffffffffffffa0;
  uint local_20;
  lzham_malloc_context malloc_context_00;
  
  *(void **)((long)in_RDI + 0x10) = in_RSI;
  malloc_context_00 = in_RDI;
  init_params::init_params((init_params *)((long)in_RDI + 0x18));
  *(undefined8 *)((long)in_RDI + 0x68) = 0xffffffffffffffff;
  *(undefined4 *)((long)in_RDI + 0x70) = 0;
  search_accelerator::search_accelerator(unaff_retaddr,malloc_context_00);
  lzham::symbol_codec::symbol_codec((symbol_codec *)((long)in_RDI + 0x478),in_RSI);
  coding_stats::coding_stats(in_stack_ffffffffffffffa0);
  vector<unsigned_char>::vector((vector<unsigned_char> *)((long)in_RDI + 0x3938),in_RSI);
  vector<unsigned_char>::vector((vector<unsigned_char> *)((long)in_RDI + 0x3950),in_RSI);
  *(undefined4 *)((long)in_RDI + 0x3968) = 0;
  *(undefined4 *)((long)in_RDI + 0x396c) = 0;
  *(undefined4 *)((long)in_RDI + 0x3970) = 0;
  *(undefined1 *)((long)in_RDI + 0x3974) = 0;
  *(undefined1 *)((long)in_RDI + 0x3975) = 0;
  *(undefined1 *)((long)in_RDI + 0x3976) = 0;
  state::state(in_stack_000000c0,in_stack_000000b8);
  state::state(in_stack_000000c0,in_stack_000000b8);
  *(undefined4 *)((long)in_RDI + 0x43e8) = 0x80;
  *(undefined4 *)((long)in_RDI + 0x43ec) = 0;
  lVar1 = (long)in_RDI + 0x43f0;
  do {
    parse_thread_state::parse_thread_state((parse_thread_state *)0x10edc0);
    lVar1 = lVar1 + 0x156800;
  } while (lVar1 != (long)in_RDI + 0xc0ebf0U);
  if (((ulong)in_RDI & 7) != 0) {
    lzham_assert("((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_lzcomp_internal.cpp"
                 ,0x50);
  }
  for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
    raw_parse_thread_state::set_malloc_context(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

lzcompressor::lzcompressor(lzham_malloc_context malloc_context) :
      m_malloc_context(malloc_context),
      m_src_size(-1),
      m_src_adler32(0),
      m_accel(malloc_context),
      m_codec(malloc_context),
      m_block_buf(malloc_context),
      m_comp_buf(malloc_context),
      m_step(0),
      m_block_start_dict_ofs(0),
      m_block_index(0),
      m_finished(false),
      m_use_task_pool(false),
      m_use_extreme_parsing(false),
      m_start_of_block_state(malloc_context),
      m_state(malloc_context),
      m_fast_bytes(128),
      m_num_parse_threads(0)
   {
      LZHAM_VERIFY( ((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0);

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_parse_thread_state); i++)
         m_parse_thread_state[i].set_malloc_context(malloc_context);
   }